

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

int __thiscall QMessageBoxPrivate::execReturnCode(QMessageBoxPrivate *this,QAbstractButton *button)

{
  long lVar1;
  qsizetype qVar2;
  QAbstractButton *in_RDI;
  long in_FS_OFFSET;
  qsizetype customButtonIndex;
  int standardButton;
  QAbstractButton **in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QDialogButtonBox *in_stack_ffffffffffffffd0;
  StandardButton local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = QDialogButtonBox::standardButton(in_stack_ffffffffffffffd0,in_RDI);
  if (local_14 == NoButton) {
    qVar2 = QListSpecialMethodsBase<QAbstractButton*>::indexOf<QAbstractButton*>
                      ((QListSpecialMethodsBase<QAbstractButton_*> *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8,0x7a4227);
    local_14 = (StandardButton)qVar2;
    if (-1 < qVar2) {
      local_14 = local_14 + 2;
    }
  }
  else if (((byte)in_RDI[0x15].super_QWidget.super_QObject & 1) != 0) {
    local_14 = oldButton(local_14);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

int QMessageBoxPrivate::execReturnCode(QAbstractButton *button)
{
    if (int standardButton = buttonBox->standardButton(button)) {
        // When using a QMessageBox with standard buttons, the return
        // code is a StandardButton value indicating the standard button
        // that was clicked.
        if (compatMode)
            return oldButton(standardButton);
        else
            return standardButton;
    } else {
        // When using QMessageBox with custom buttons, the return code
        // is an opaque value, and the user is expected to use clickedButton()
        // to determine which button was clicked. We make sure to keep the opaque
        // value out of the QDialog::DialogCode range, so we can distinguish them.
        auto customButtonIndex = customButtonList.indexOf(button);
        if (customButtonIndex >= 0)
            return QDialog::DialogCode::Accepted + customButtonIndex + 1;
        else
            return customButtonIndex; // Not found, return -1
    }
}